

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

int log_level(char *name,char *level,size_t length)

{
  log_level_id level_00;
  log_impl impl;
  int iVar1;
  
  level_00 = log_level_to_enum(level,length);
  if (level_00 < LOG_LEVEL_SIZE) {
    impl = log_singleton_get(name);
    iVar1 = 0;
    if (impl != (log_impl)0x0) {
      log_impl_verbosity(impl,level_00);
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int log_level(const char *name, const char *level, size_t length)
{
	enum log_level_id id = log_level_to_enum(level, length);

	if (id < LOG_LEVEL_SIZE)
	{
		log_impl impl = log_singleton_get(name);

		if (impl != NULL)
		{
			log_impl_verbosity(impl, id);
		}

		return 0;
	}

	return 1;
}